

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feed_info.c
# Opt level: O0

void init_feed_info(feed_info_t *record)

{
  feed_info_t *record_local;
  
  strcpy(record->feed_publisher_name,"");
  strcpy(record->feed_publisher_url,"");
  strcpy(record->feed_lang,"");
  strcpy(record->feed_start_date,"");
  strcpy(record->feed_end_date,"");
  strcpy(record->feed_version,"");
  strcpy(record->feed_contact_email,"");
  strcpy(record->feed_contact_url,"");
  return;
}

Assistant:

void init_feed_info(feed_info_t *record) {
    strcpy(record->feed_publisher_name, "");
    strcpy(record->feed_publisher_url, "");
    strcpy(record->feed_lang, "");
    strcpy(record->feed_start_date, "");
    strcpy(record->feed_end_date, "");
    strcpy(record->feed_version, "");
    strcpy(record->feed_contact_email, "");
    strcpy(record->feed_contact_url, "");
}